

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_UpdateMonitors(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImGuiPlatformIO *pIVar3;
  GLFWmonitor **ppGVar4;
  GLFWvidmode *pGVar5;
  int n;
  long lVar6;
  int y;
  int x;
  float x_scale;
  int h;
  int w;
  int monitors_count;
  float y_scale;
  ImGuiPlatformMonitor monitor;
  int local_74;
  int local_70;
  float local_6c;
  int local_68;
  int local_64;
  int local_60;
  float local_5c;
  ImGuiPlatformMonitor local_58;
  
  pIVar3 = ImGui::GetPlatformIO();
  local_60 = 0;
  ppGVar4 = glfwGetMonitors(&local_60);
  ImVector<ImGuiPlatformMonitor>::resize(&pIVar3->Monitors,0);
  for (lVar6 = 0; lVar6 < local_60; lVar6 = lVar6 + 1) {
    local_58.WorkPos.x = 0.0;
    local_58.WorkPos.y = 0.0;
    local_58.WorkSize.x = 0.0;
    local_58.WorkSize.y = 0.0;
    local_58.MainPos.x = 0.0;
    local_58.MainPos.y = 0.0;
    local_58.MainSize.x = 0.0;
    local_58.MainSize.y = 0.0;
    local_58.DpiScale = 1.0;
    glfwGetMonitorPos(ppGVar4[lVar6],&local_70,&local_74);
    pGVar5 = glfwGetVideoMode(ppGVar4[lVar6]);
    local_58.MainPos.y = (float)local_74;
    local_58.MainPos.x = (float)local_70;
    uVar1 = pGVar5->width;
    uVar2 = pGVar5->height;
    local_58.MainSize.y = (float)(int)uVar2;
    local_58.MainSize.x = (float)(int)uVar1;
    glfwGetMonitorWorkarea(ppGVar4[lVar6],&local_70,&local_74,&local_64,&local_68);
    local_58.WorkPos.y = (float)local_74;
    local_58.WorkPos.x = (float)local_70;
    local_58.WorkSize.y = (float)local_68;
    local_58.WorkSize.x = (float)local_64;
    glfwGetMonitorContentScale(ppGVar4[lVar6],&local_6c,&local_5c);
    local_58.DpiScale = local_6c;
    ImVector<ImGuiPlatformMonitor>::push_back(&pIVar3->Monitors,&local_58);
  }
  g_WantUpdateMonitors = 1;
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMonitors()
{
    ImGuiPlatformIO& platform_io = ImGui::GetPlatformIO();
    int monitors_count = 0;
    GLFWmonitor** glfw_monitors = glfwGetMonitors(&monitors_count);
    platform_io.Monitors.resize(0);
    for (int n = 0; n < monitors_count; n++)
    {
        ImGuiPlatformMonitor monitor;
        int x, y;
        glfwGetMonitorPos(glfw_monitors[n], &x, &y);
        const GLFWvidmode* vid_mode = glfwGetVideoMode(glfw_monitors[n]);
#if GLFW_HAS_MONITOR_WORK_AREA
        monitor.MainPos = ImVec2((float)x, (float)y);
        monitor.MainSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
        int w, h;
        glfwGetMonitorWorkarea(glfw_monitors[n], &x, &y, &w, &h);
        monitor.WorkPos = ImVec2((float)x, (float)y);;
        monitor.WorkSize = ImVec2((float)w, (float)h);
#else
        monitor.MainPos = monitor.WorkPos = ImVec2((float)x, (float)y);
        monitor.MainSize = monitor.WorkSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
#endif
#if GLFW_HAS_PER_MONITOR_DPI
        // Warning: the validity of monitor DPI information on Windows depends on the application DPI awareness settings, which generally needs to be set in the manifest or at runtime.
        float x_scale, y_scale;
        glfwGetMonitorContentScale(glfw_monitors[n], &x_scale, &y_scale);
        monitor.DpiScale = x_scale;
#endif
        platform_io.Monitors.push_back(monitor);
    }
    g_WantUpdateMonitors = false;
}